

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CfgNode.cpp
# Opt level: O0

void __thiscall CfgNode::BlockData::addInstruction(BlockData *this,Instruction *instr)

{
  Instruction *this_00;
  bool bVar1;
  int iVar2;
  reference ppIVar3;
  Addr AVar4;
  Addr AVar5;
  int size;
  Instruction *prev;
  Instruction *instr_local;
  BlockData *this_local;
  
  bVar1 = false;
  prev = instr;
  instr_local = (Instruction *)this;
  if (instr != (Instruction *)0x0) {
    iVar2 = Instruction::size(instr);
    bVar1 = 0 < iVar2;
  }
  if (!bVar1) {
    __assert_fail("instr != 0 && instr->size() > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CfgNode.cpp"
                  ,0x69,"void CfgNode::BlockData::addInstruction(Instruction *)");
  }
  bVar1 = std::__cxx11::list<Instruction_*,_std::allocator<Instruction_*>_>::empty(&this->m_instrs);
  if (bVar1) {
    AVar4 = Instruction::addr(prev);
    if (AVar4 != (this->super_Data).m_addr) {
      __assert_fail("instr->addr() == m_addr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CfgNode.cpp"
                    ,0x6c,"void CfgNode::BlockData::addInstruction(Instruction *)");
    }
    std::__cxx11::list<Instruction_*,_std::allocator<Instruction_*>_>::push_back
              (&this->m_instrs,&prev);
  }
  else {
    ppIVar3 = std::__cxx11::list<Instruction_*,_std::allocator<Instruction_*>_>::back
                        (&this->m_instrs);
    this_00 = *ppIVar3;
    AVar4 = Instruction::addr(prev);
    AVar5 = Instruction::addr(this_00);
    iVar2 = Instruction::size(this_00);
    if (AVar4 != AVar5 + (long)iVar2) {
      __assert_fail("instr->addr() == (prev->addr() + prev->size())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CfgNode.cpp"
                    ,0x70,"void CfgNode::BlockData::addInstruction(Instruction *)");
    }
    std::__cxx11::list<Instruction_*,_std::allocator<Instruction_*>_>::push_back
              (&this->m_instrs,&prev);
  }
  AVar4 = Instruction::addr(prev);
  iVar2 = Instruction::size(prev);
  iVar2 = ((int)AVar4 + iVar2) - (int)(this->super_Data).m_addr;
  if (this->m_size < iVar2) {
    this->m_size = iVar2;
  }
  return;
}

Assistant:

void CfgNode::BlockData::addInstruction(Instruction* instr) {
	assert(instr != 0 && instr->size() > 0);

	if (m_instrs.empty()) {
		assert(instr->addr() == m_addr);
		m_instrs.push_back(instr);
	} else {
		Instruction* prev = m_instrs.back();
		assert(instr->addr() == (prev->addr() + prev->size()));
		m_instrs.push_back(instr);
	}

	int size = (instr->addr() + instr->size()) - m_addr;
	if (size > m_size)
		m_size = size;
}